

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_test.cpp
# Opt level: O2

void try_reference(void)

{
  long lVar1;
  undefined4 *puVar2;
  long lVar3;
  ostream *poVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  
  iVar5 = 0x1000001;
  lVar1 = std::chrono::_V2::system_clock::now();
  do {
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      lVar3 = std::chrono::_V2::system_clock::now();
      dVar6 = (double)(lVar3 - lVar1) / 1000000000.0;
      dVar7 = dVar6 * 1000.0 * 1000.0 * 1000.0 * 5.9604644775390625e-08;
      expand_name("try_reference");
      poVar4 = std::operator<<((ostream *)&std::cout,expand_name::buf);
      std::operator<<(poVar4,": ");
      poVar4 = std::ostream::_M_insert<double>(dVar7);
      std::operator<<(poVar4,"ns per operation,\t");
      poVar4 = std::ostream::_M_insert<double>(dVar7 / unit);
      std::operator<<(poVar4," ticks,\t");
      poVar4 = std::ostream::_M_insert<double>(((16777216.0 / dVar6) / 1000.0) / 1000.0);
      poVar4 = std::operator<<(poVar4," Mrps");
      std::endl<char,std::char_traits<char>>(poVar4);
      return;
    }
  } while (must_throw != true);
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0;
  __cxa_throw(puVar2,&int::typeinfo,0);
}

Assistant:

static void __attribute__((noinline))
try_reference()
{
    now_t start = now();
    const size_t COUNT = SIZE;
    for (uint32_t i = 0; i < COUNT; i++)
    {
        if (must_throw)
            throw 0;
    }
    now_t stop = now();

    std::chrono::duration<double> diff = stop - start;
    double ns_per_op = diff.count() * 1000 * 1000 * 1000 / COUNT;
    double Mrps = COUNT / diff.count() / 1000 / 1000;
    std::cout << NAME << ": " << ns_per_op << "ns per operation,\t"
              << (ns_per_op / unit) << " ticks,\t"
              << Mrps << " Mrps" << std::endl;

}